

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::dispose
          (ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *this)

{
  Result *firstElement;
  RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *pRVar1;
  Result *pRVar2;
  Result *endCopy;
  Result *posCopy;
  Result *ptrCopy;
  ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pRVar2 = this->endPtr;
  if (firstElement != (Result *)0x0) {
    this->ptr = (Result *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
    this->endPtr = (Result *)0x0;
    ArrayDisposer::dispose<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x28,
               ((long)pRVar2 - (long)firstElement) / 0x28);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }